

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_unpack_goaway_payload2
              (nghttp2_goaway *frame,uint8_t *payload,size_t payloadlen,nghttp2_mem *mem)

{
  size_t local_40;
  size_t var_gift_payloadlen;
  uint8_t *var_gift_payload;
  nghttp2_mem *mem_local;
  size_t payloadlen_local;
  uint8_t *payload_local;
  nghttp2_goaway *frame_local;
  
  if (payloadlen < 9) {
    local_40 = 0;
  }
  else {
    local_40 = payloadlen - 8;
  }
  if (local_40 == 0) {
    var_gift_payloadlen = 0;
  }
  else {
    var_gift_payloadlen = (size_t)nghttp2_mem_malloc(mem,local_40);
    if ((void *)var_gift_payloadlen == (void *)0x0) {
      return -0x385;
    }
    memcpy((void *)var_gift_payloadlen,payload + 8,local_40);
  }
  nghttp2_frame_unpack_goaway_payload(frame,payload,(uint8_t *)var_gift_payloadlen,local_40);
  return 0;
}

Assistant:

int nghttp2_frame_unpack_goaway_payload2(nghttp2_goaway *frame,
                                         const uint8_t *payload,
                                         size_t payloadlen, nghttp2_mem *mem) {
  uint8_t *var_gift_payload;
  size_t var_gift_payloadlen;

  if (payloadlen > 8) {
    var_gift_payloadlen = payloadlen - 8;
  } else {
    var_gift_payloadlen = 0;
  }

  if (!var_gift_payloadlen) {
    var_gift_payload = NULL;
  } else {
    var_gift_payload = nghttp2_mem_malloc(mem, var_gift_payloadlen);

    if (var_gift_payload == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }

    memcpy(var_gift_payload, payload + 8, var_gift_payloadlen);
  }

  nghttp2_frame_unpack_goaway_payload(frame, payload, var_gift_payload,
                                      var_gift_payloadlen);

  return 0;
}